

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_case_info.hpp
# Opt level: O3

void Catch::enforceNotReservedTag(string *tag,SourceLineInfo *_lineInfo)

{
  SpecialProperties SVar1;
  int iVar2;
  ulong in_RAX;
  ostream *poVar3;
  Colour colourGuard_1;
  Colour colourGuard;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  SVar1 = parseSpecialTag(tag);
  if ((SVar1 == None) && (tag->_M_string_length != 0)) {
    iVar2 = isalnum((int)*(tag->_M_dataplus)._M_p);
    if (iVar2 == 0) {
      uStack_18 = uStack_18 & 0xffffffffffffff;
      Colour::use(Red);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Tag name [",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(tag->_M_dataplus)._M_p,tag->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] not allowed.\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Tag names starting with non alpha-numeric characters are reserved\n",0x42);
      Colour::~Colour((Colour *)((long)&uStack_18 + 7));
      uStack_18._0_7_ = (uint7)(uint6)uStack_18;
      Colour::use(FileName);
      operator<<((ostream *)&std::cerr,_lineInfo);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      Colour::~Colour((Colour *)((long)&uStack_18 + 6));
      exit(1);
    }
  }
  return;
}

Assistant:

inline void enforceNotReservedTag( std::string const& tag, SourceLineInfo const& _lineInfo ) {
        if( isReservedTag( tag ) ) {
            {
                Colour colourGuard( Colour::Red );
                Catch::cerr()
                    << "Tag name [" << tag << "] not allowed.\n"
                    << "Tag names starting with non alpha-numeric characters are reserved\n";
            }
            {
                Colour colourGuard( Colour::FileName );
                Catch::cerr() << _lineInfo << std::endl;
            }
            exit(1);
        }
    }